

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UBool __thiscall icu_63::TZEnumeration::getID(TZEnumeration *this,int32_t i,UErrorCode *ec)

{
  UBool UVar1;
  __off_t __length;
  ConstChar16Ptr local_80;
  UnicodeString local_78;
  UResourceBundle *local_38;
  UResourceBundle *top;
  UChar *id;
  UErrorCode *pUStack_20;
  int32_t idLen;
  UErrorCode *ec_local;
  TZEnumeration *pTStack_10;
  int32_t i_local;
  TZEnumeration *this_local;
  
  id._4_4_ = 0;
  top = (UResourceBundle *)0x0;
  pUStack_20 = ec;
  ec_local._4_4_ = i;
  pTStack_10 = this;
  local_38 = ures_openDirect_63((char *)0x0,"zoneinfo64",ec);
  local_38 = ures_getByKey_63(local_38,"Names",local_38,pUStack_20);
  top = (UResourceBundle *)
        ures_getStringByIndex_63(local_38,ec_local._4_4_,(int32_t *)((long)&id + 4),pUStack_20);
  UVar1 = ::U_FAILURE(*pUStack_20);
  if (UVar1 == '\0') {
    ConstChar16Ptr::ConstChar16Ptr(&local_80,(char16_t *)top);
    UnicodeString::UnicodeString(&local_78,'\x01',&local_80,id._4_4_);
    UnicodeString::fastCopyFrom(&(this->super_StringEnumeration).unistr,&local_78);
    UnicodeString::~UnicodeString(&local_78);
    ConstChar16Ptr::~ConstChar16Ptr(&local_80);
  }
  else {
    UnicodeString::truncate(&(this->super_StringEnumeration).unistr,(char *)0x0,__length);
  }
  ures_close_63(local_38);
  UVar1 = ::U_SUCCESS(*pUStack_20);
  return UVar1;
}

Assistant:

UBool getID(int32_t i, UErrorCode& ec) {
        int32_t idLen = 0;
        const UChar* id = NULL;
        UResourceBundle *top = ures_openDirect(0, kZONEINFO, &ec);
        top = ures_getByKey(top, kNAMES, top, &ec); // dereference Zones section
        id = ures_getStringByIndex(top, i, &idLen, &ec);
        if(U_FAILURE(ec)) {
            unistr.truncate(0);
        }
        else {
            unistr.fastCopyFrom(UnicodeString(TRUE, id, idLen));
        }
        ures_close(top);
        return U_SUCCESS(ec);
    }